

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# perfetto.cc
# Opt level: O0

void __thiscall
perfetto::protos::gen::TraceConfig_StatsdMetadata::TraceConfig_StatsdMetadata
          (TraceConfig_StatsdMetadata *this)

{
  TraceConfig_StatsdMetadata *this_local;
  
  protozero::CppMessageObj::CppMessageObj(&this->super_CppMessageObj);
  (this->super_CppMessageObj)._vptr_CppMessageObj =
       (_func_int **)&PTR__TraceConfig_StatsdMetadata_009c1a08;
  this->triggering_alert_id_ = 0;
  this->triggering_config_uid_ = 0;
  this->triggering_config_id_ = 0;
  this->triggering_subscription_id_ = 0;
  ::std::__cxx11::string::string((string *)&this->unknown_fields_);
  std::bitset<5UL>::bitset(&this->_has_field_);
  return;
}

Assistant:

TraceConfig_StatsdMetadata::TraceConfig_StatsdMetadata() = default;